

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

Data2D<double> * __thiscall
TasGrid::GridLocalPolynomial::encodeSupportForGPU<0,(TasGrid::TypeOneDRule)37,double>
          (Data2D<double> *__return_storage_ptr__,GridLocalPolynomial *this,MultiIndexSet *work)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  size_t sVar4;
  pointer pdVar5;
  bool bVar6;
  size_t sVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  allocator_type local_31;
  
  sVar7 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  iVar1 = work->cache_num_indexes;
  __return_storage_ptr__->stride = sVar7;
  __return_storage_ptr__->num_strips = (long)iVar1;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vec,(long)iVar1 * sVar7,&local_31);
  iVar1 = work->cache_num_indexes;
  if (0 < (long)iVar1) {
    sVar7 = work->num_dimensions;
    piVar3 = (work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = __return_storage_ptr__->stride;
    pdVar5 = (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
    lVar9 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar11 = 0;
        do {
          uVar8 = piVar3[sVar7 * lVar9 + uVar11];
          dVar12 = 1.0;
          if (0 < (int)uVar8) {
            iVar10 = 1;
            do {
              iVar10 = iVar10 * 3;
              bVar6 = 2 < uVar8;
              uVar8 = uVar8 / 3;
            } while (bVar6);
            dVar12 = (double)iVar10;
          }
          pdVar5[sVar4 * lVar9 + uVar11] = 1.0 / dVar12;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<T> encodeSupportForGPU(const MultiIndexSet &work) const{
        Data2D<T> cpu_support(num_dimensions, work.getNumIndexes());
        for(int i=0; i<work.getNumIndexes(); i++){
            const int* p = work.getIndex(i);
            T *s = cpu_support.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (ord == 0){
                    s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::pwc>(p[j]));
                } else {
                    switch(crule) {
                        case rule_localp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp>(p[j]));
                            break;
                        case rule_semilocalp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::semilocalp>(p[j]));
                            break;
                        case rule_localp0:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp0>(p[j]));
                            break;
                        case rule_localpb:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localpb>(p[j]));
                            break;
                    };
                    if (ord == 2) s[j] *= s[j];
                    if ((crule == rule_localp) || (crule == rule_semilocalp)) if (p[j] == 0) s[j] = static_cast<T>(-1.0); // constant function
                    if ((crule == rule_localp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-2.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-3.0);
                    }
                    if ((crule == rule_semilocalp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-4.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-5.0);
                    }
                    if ((crule == rule_localpb) && (ord == 2)){
                        if (p[j] < 2) s[j] = static_cast<T>(-2.0); // linear functions on level 0
                    }
                }
            }
        }
        return cpu_support;
    }